

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O3

string_view __thiscall csv::CSVRow::get_field(CSVRow *this,size_t index)

{
  ParseFlags PVar1;
  element_type *peVar2;
  byte bVar3;
  RawCSVField *pRVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  runtime_error *this_00;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pcVar10;
  ulong uVar11;
  string_view sVar12;
  size_t field_index;
  size_t local_38;
  
  if (this->row_length <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = index + this->fields_start;
  peVar2 = (this->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pRVar4 = internals::CSVFieldList::operator[](&peVar2->fields,local_38);
  uVar11 = (peVar2->data)._M_len;
  uVar9 = pRVar4->start + this->data_start;
  uVar8 = uVar11 - uVar9;
  if (uVar11 < uVar9) {
    uVar7 = std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar9);
    __cxa_free_exception(uVar9);
    _Unwind_Resume(uVar7);
  }
  pcVar10 = (peVar2->data)._M_str + uVar9;
  if (pRVar4->has_double_quote == true) {
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&peVar2->double_quote_fields,&local_38);
    uVar11 = pmVar5->_M_string_length;
    if (uVar11 == 0) {
      sVar6 = pRVar4->length;
      if (sVar6 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        bVar3 = 0;
        do {
          PVar1 = (((this->data).
                    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->parse_flags)._M_elems[(long)pcVar10[uVar11] + 0x80];
          if ((bool)(PVar1 == QUOTE & bVar3)) {
            bVar3 = 0;
          }
          else {
            bVar3 = PVar1 == QUOTE | bVar3;
            std::__cxx11::string::push_back((char)pmVar5);
            sVar6 = pRVar4->length;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < sVar6);
        uVar11 = pmVar5->_M_string_length;
      }
    }
    pcVar10 = (pmVar5->_M_dataplus)._M_p;
  }
  else {
    uVar11 = pRVar4->length;
    if (uVar8 < pRVar4->length) {
      uVar11 = uVar8;
    }
  }
  sVar12._M_str = pcVar10;
  sVar12._M_len = uVar11;
  return sVar12;
}

Assistant:

CSV_INLINE csv::string_view CSVRow::get_field(size_t index) const
    {
        using internals::ParseFlags;

        if (index >= this->size())
            throw std::runtime_error("Index out of bounds.");

        const size_t field_index = this->fields_start + index;
        auto& field = this->data->fields[field_index];
        auto field_str = csv::string_view(this->data->data).substr(this->data_start + field.start);

        if (field.has_double_quote) {
            auto& value = this->data->double_quote_fields[field_index];
            if (value.empty()) {
                bool prev_ch_quote = false;
                for (size_t i = 0; i < field.length; i++) {
                    if (this->data->parse_flags[field_str[i] + 128] == ParseFlags::QUOTE) {
                        if (prev_ch_quote) {
                            prev_ch_quote = false;
                            continue;
                        }
                        else {
                            prev_ch_quote = true;
                        }
                    }

                    value += field_str[i];
                }
            }

            return csv::string_view(value);
        }

        return field_str.substr(0, field.length);
    }